

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.cc
# Opt level: O0

void el::Configurations::Parser::ignoreComments(string *line)

{
  char *pcVar1;
  bool bVar2;
  string local_48 [32];
  ulong local_28;
  size_t quotesEnd;
  size_t quotesStart;
  size_t foundAt;
  string *line_local;
  
  quotesStart = 0;
  foundAt = (size_t)line;
  quotesEnd = std::__cxx11::string::find((char *)line,0x219eb9);
  local_28 = 0xffffffffffffffff;
  if (quotesEnd != 0xffffffffffffffff) {
    local_28 = std::__cxx11::string::find((char *)foundAt,0x219eb9);
    while( true ) {
      bVar2 = false;
      if (local_28 != 0xffffffffffffffff) {
        pcVar1 = (char *)std::__cxx11::string::at(foundAt);
        bVar2 = *pcVar1 == '\\';
      }
      if (!bVar2) break;
      local_28 = std::__cxx11::string::find((char *)foundAt,0x219eb9);
    }
  }
  quotesStart = std::__cxx11::string::find
                          ((char *)foundAt,(ulong)el::base::consts::kConfigurationComment);
  if (quotesStart != 0xffffffffffffffff) {
    if (quotesStart < local_28) {
      quotesStart = std::__cxx11::string::find
                              ((char *)foundAt,(ulong)el::base::consts::kConfigurationComment);
    }
    std::__cxx11::string::substr((ulong)local_48,foundAt);
    std::__cxx11::string::operator=((string *)foundAt,local_48);
    std::__cxx11::string::~string(local_48);
  }
  return;
}

Assistant:

void Configurations::Parser::ignoreComments(std::string* line) {
  std::size_t foundAt = 0;
  std::size_t quotesStart = line->find("\"");
  std::size_t quotesEnd = std::string::npos;
  if (quotesStart != std::string::npos) {
    quotesEnd = line->find("\"", quotesStart + 1);
    while (quotesEnd != std::string::npos && line->at(quotesEnd - 1) == '\\') {
      // Do not erase slash yet - we will erase it in parseLine(..) while loop
      quotesEnd = line->find("\"", quotesEnd + 2);
    }
  }
  if ((foundAt = line->find(base::consts::kConfigurationComment)) != std::string::npos) {
    if (foundAt < quotesEnd) {
      foundAt = line->find(base::consts::kConfigurationComment, quotesEnd + 1);
    }
    *line = line->substr(0, foundAt);
  }
}